

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::SigmoidKernel::MergePartialFromCodedStream
          (SigmoidKernel *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  double *pdVar3;
  bool bVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  double local_30;
  
LAB_0013ce17:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0013ce3a;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0013ce3a:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar8 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar6 | uVar8;
    }
    uVar6 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) != 0) {
      uVar7 = (uint)(uVar8 >> 3) & 0x1fffffff;
      if (uVar7 == 2) {
        if ((char)uVar8 == '\x11') {
          pdVar3 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar3 < 8) {
            bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                              (input,(uint64 *)&local_30);
            dVar9 = local_30;
            if (!bVar5) {
              return false;
            }
          }
          else {
            dVar9 = *pdVar3;
            input->buffer_ = (uint8 *)(pdVar3 + 1);
          }
          this->c_ = dVar9;
          goto LAB_0013ce17;
        }
      }
      else if ((uVar7 == 1) && ((char)uVar8 == '\t')) {
        pdVar3 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar3 < 8) {
          bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                            (input,(uint64 *)&local_30);
          dVar9 = local_30;
          if (!bVar5) {
            return false;
          }
        }
        else {
          dVar9 = *pdVar3;
          input->buffer_ = (uint8 *)(pdVar3 + 1);
        }
        this->gamma_ = dVar9;
        goto LAB_0013ce17;
      }
    }
    bVar5 = (uVar6 & 7) == 4 || uVar6 == 0;
    if (bVar5) {
      return bVar5;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
    if (!bVar4) {
      return bVar5;
    }
  } while( true );
}

Assistant:

bool SigmoidKernel::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SigmoidKernel)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // double gamma = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(9u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &gamma_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double c = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(17u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &c_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SigmoidKernel)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SigmoidKernel)
  return false;
#undef DO_
}